

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O1

void EmitDebugSectionImpl
               (Data *DI,EmitFuncType EmitFunc,StringRef Sec,
               StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
               *OutputBuffers)

{
  long *plVar1;
  string *psVar2;
  _Alloc_hider BufferName;
  undefined8 uVar3;
  pair<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_bool>
  pVar4;
  StringRef InputData;
  Twine local_a0;
  undefined1 local_88 [8];
  raw_string_ostream DebugInfoStream;
  string Data;
  
  DebugInfoStream.OS = (string *)&Data._M_string_length;
  Data._M_dataplus._M_p = (pointer)0x0;
  Data._M_string_length._0_1_ = 0;
  DebugInfoStream.super_raw_ostream.OutBufCur._0_4_ = 1;
  DebugInfoStream.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
  DebugInfoStream.super_raw_ostream.OutBufStart = (char *)0x0;
  DebugInfoStream.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_88 = (undefined1  [8])&PTR__raw_string_ostream_010994b8;
  DebugInfoStream.super_raw_ostream._32_8_ = &DebugInfoStream.OS;
  (*EmitFunc)((raw_ostream *)local_88,DI);
  if ((_func_int **)DebugInfoStream.super_raw_ostream.OutBufEnd !=
      DebugInfoStream.super_raw_ostream._vptr_raw_ostream) {
    llvm::raw_ostream::flush_nonempty((raw_ostream *)local_88);
  }
  BufferName._M_p = Data._M_dataplus._M_p;
  psVar2 = DebugInfoStream.OS;
  if (Data._M_dataplus._M_p != (pointer)0x0) {
    llvm::Twine::Twine(&local_a0,"");
    InputData.Length = (size_t)psVar2;
    InputData.Data = (char *)((long)&Data.field_2 + 8);
    llvm::MemoryBuffer::getMemBufferCopy(InputData,(Twine *)BufferName._M_p);
    pVar4 = llvm::
            StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
            ::try_emplace<>(OutputBuffers,Sec);
    uVar3 = Data.field_2._8_8_;
    Data.field_2._8_8_ = 0;
    plVar1 = *(long **)(*(long *)pVar4.first.
                                 super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
                                 .Ptr.
                                 super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
                       + 8);
    *(undefined8 *)
     (*(long *)pVar4.first.
               super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
               .Ptr.
               super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
     + 8) = uVar3;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if (Data.field_2._8_8_ != 0) {
      (**(code **)(*(long *)Data.field_2._8_8_ + 8))();
    }
  }
  llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_88);
  if (DebugInfoStream.OS != (string *)&Data._M_string_length) {
    operator_delete(DebugInfoStream.OS,
                    CONCAT71(Data._M_string_length._1_7_,(undefined1)Data._M_string_length) + 1);
  }
  return;
}

Assistant:

static void
EmitDebugSectionImpl(const DWARFYAML::Data &DI, EmitFuncType EmitFunc,
                     StringRef Sec,
                     StringMap<std::unique_ptr<MemoryBuffer>> &OutputBuffers) {
  std::string Data;
  raw_string_ostream DebugInfoStream(Data);
  EmitFunc(DebugInfoStream, DI);
  DebugInfoStream.flush();
  if (!Data.empty())
    OutputBuffers[Sec] = MemoryBuffer::getMemBufferCopy(Data);
}